

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall wabt::TypeChecker::PushTypes(TypeChecker *this,TypeVector *types)

{
  Type *pTVar1;
  Type *pTVar2;
  
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    PushType(this,*pTVar2);
  }
  return;
}

Assistant:

void TypeChecker::PushTypes(const TypeVector& types) {
  for (Type type : types) {
    PushType(type);
  }
}